

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mod.c
# Opt level: O2

void zzSubWMod(word *b,word *a,word w,word *mod,size_t n)

{
  word wVar1;
  
  wVar1 = zzSubW(b,a,n,w);
  zzAddAndW(b,mod,n,-wVar1);
  return;
}

Assistant:

void SAFE(zzSubWMod)(word b[], const word a[], register word w, 
	 const word mod[], size_t n)
{
	register word mask;
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	ASSERT(wwIsDisjoint(b, mod, n));
	ASSERT(wwCmp(a, mod, n) < 0 && wwCmpW(mod, n, w) > 0);
	// mask <- a < w ? WORD_MAX : WORD_0
	mask = WORD_0 - zzSubW(b, a, n, w);
	zzAddAndW(b, mod,  n, mask);
	w = mask = 0;
}